

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O3

string * __thiscall
RealTrafficConnection::GetStatusStr_abi_cxx11_
          (string *__return_storage_ptr__,RealTrafficConnection *this)

{
  rtStatusTy rVar1;
  char *pcVar2;
  char *pcVar3;
  
  rVar1 = this->status;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(rVar1) {
  default:
    pcVar2 = "";
    pcVar3 = "";
    break;
  case RT_STATUS_STARTING:
    pcVar3 = "Waiting for RealTraffic...";
    pcVar2 = "";
    break;
  case RT_STATUS_CONNECTED_PASSIVELY:
    pcVar3 = "Connected passively";
    pcVar2 = "";
    break;
  case RT_STATUS_CONNECTED_TO:
    pcVar3 = "Connected, waiting...";
    pcVar2 = "";
    break;
  case RT_STATUS_CONNECTED_FULL:
    pcVar3 = "Fully connected";
    pcVar2 = "";
    break;
  case RT_STATUS_STOPPING:
    pcVar3 = "Stopping...";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string RealTrafficConnection::GetStatusStr() const
{
    switch (status) {
        case RT_STATUS_NONE:                return "";
        case RT_STATUS_STARTING:            return "Waiting for RealTraffic...";
        case RT_STATUS_CONNECTED_PASSIVELY: return "Connected passively";
        case RT_STATUS_CONNECTED_TO:        return "Connected, waiting...";
        case RT_STATUS_CONNECTED_FULL:      return "Fully connected";
        case RT_STATUS_STOPPING:            return "Stopping...";
    }
    return "";
}